

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

void stumpless_close_buffer_target(stumpless_target *target)

{
  void *__ptr;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    return;
  }
  if (target->type != STUMPLESS_BUFFER_TARGET) {
    raise_target_incompatible("target type is incompatible with this operation");
    return;
  }
  clear_error();
  __ptr = target->id;
  pthread_destroy_mutex((pthread_mutex_t *)((long)__ptr + 0x20));
  free_mem(__ptr);
  destroy_target(target);
  return;
}

Assistant:

void
stumpless_close_buffer_target( const struct stumpless_target *target ) {
  if( !target ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "target" ) );
    return;
  }

  if( target->type != STUMPLESS_BUFFER_TARGET ) {
    raise_target_incompatible( L10N_INVALID_TARGET_TYPE_ERROR_MESSAGE );
    return;
  }

  clear_error(  );

  destroy_buffer_target( target->id );
  destroy_target( target );
}